

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt.cpp
# Opt level: O2

PatternList *
parse_expr(PatternList *__return_storage_ptr__,Tokens *tokens,
          vector<docopt::Option,_std::allocator<docopt::Option>_> *options)

{
  pointer *__return_storage_ptr___00;
  bool bVar1;
  string *psVar2;
  initializer_list<std::shared_ptr<docopt::Pattern>_> __l;
  string local_b8;
  shared_ptr<docopt::Pattern> local_98;
  undefined1 auStack_88 [8];
  PatternList ret;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_68 [2];
  undefined1 auStack_58 [8];
  PatternList seq;
  
  parse_seq((PatternList *)auStack_58,tokens,options);
  psVar2 = Tokens::current_abi_cxx11_(tokens);
  bVar1 = std::operator!=(psVar2,"|");
  if (bVar1) {
    (__return_storage_ptr__->
    super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)auStack_58;
    (__return_storage_ptr__->
    super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
    )._M_impl.super__Vector_impl_data._M_finish =
         seq.
         super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (__return_storage_ptr__->
    super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage =
         seq.
         super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    auStack_58 = (undefined1  [8])0x0;
    seq.
    super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    seq.
    super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  }
  else {
    auStack_88 = (undefined1  [8])0x0;
    ret.
    super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    ret.
    super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    maybe_collapse_to_required
              ((PatternList *)
               &ret.
                super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>::
    emplace_back<std::shared_ptr<docopt::Pattern>>
              ((vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>
                *)auStack_88,
               (shared_ptr<docopt::Pattern> *)
               &ret.
                super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_68);
    __return_storage_ptr___00 =
         &ret.
          super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage;
    while( true ) {
      psVar2 = Tokens::current_abi_cxx11_(tokens);
      bVar1 = std::operator==(psVar2,"|");
      if (!bVar1) break;
      Tokens::pop_abi_cxx11_(&local_b8,tokens);
      std::__cxx11::string::~string((string *)&local_b8);
      parse_seq((PatternList *)__return_storage_ptr___00,tokens,options);
      std::
      vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>::
      _M_move_assign((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                      *)auStack_58,__return_storage_ptr___00);
      std::
      vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>::
      ~vector((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
               *)__return_storage_ptr___00);
      maybe_collapse_to_required((PatternList *)__return_storage_ptr___00);
      std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>
      ::emplace_back<std::shared_ptr<docopt::Pattern>>
                ((vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>
                  *)auStack_88,(shared_ptr<docopt::Pattern> *)__return_storage_ptr___00);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_68);
    }
    if ((long)ret.
              super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
              ._M_impl.super__Vector_impl_data._M_start - (long)auStack_88 == 0x10) {
      local_98.super___shared_ptr<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           ((__shared_ptr<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2> *)auStack_88)->_M_ptr;
      local_98.super___shared_ptr<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (((__shared_ptr<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2> *)auStack_88)->_M_refcount).
           _M_pi;
      (((__shared_ptr<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2> *)auStack_88)->_M_refcount)._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      ((__shared_ptr<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2> *)auStack_88)->_M_ptr =
           (element_type *)0x0;
    }
    else {
      std::
      make_shared<docopt::Either,std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>>
                ((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                  *)&ret.
                     super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
      local_98.super___shared_ptr<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           ret.
           super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_98.super___shared_ptr<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           a_Stack_68[0]._M_pi;
      ret.
      super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      a_Stack_68[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_68);
    }
    __l._M_len = 1;
    __l._M_array = &local_98;
    std::
    vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>::
    vector(__return_storage_ptr__,__l,
           (allocator_type *)
           &ret.
            super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_98.super___shared_ptr<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
    std::
    vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>::
    ~vector((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
             *)auStack_88);
  }
  std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  ::~vector((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
             *)auStack_58);
  return __return_storage_ptr__;
}

Assistant:

PatternList parse_expr(Tokens& tokens, std::vector<Option>& options)
{
	// expr ::= seq ( '|' seq )* ;

	auto seq = parse_seq(tokens, options);

	if (tokens.current() != "|")
		return seq;

	PatternList ret;
	ret.emplace_back(maybe_collapse_to_required(std::move(seq)));

	while (tokens.current() == "|") {
		tokens.pop();
		seq = parse_seq(tokens, options);
		ret.emplace_back(maybe_collapse_to_required(std::move(seq)));
	}

	return { maybe_collapse_to_either(std::move(ret)) };
}